

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetPropertyNameFromId(JsPropertyIdRef propertyId,WCHAR **name)

{
  anon_class_16_2_f9b1ce94 fn;
  JsErrorCode JVar1;
  WCHAR **local_18;
  WCHAR **name_local;
  JsPropertyIdRef propertyId_local;
  
  fn.name = &local_18;
  fn.propertyId = &name_local;
  local_18 = name;
  name_local = (WCHAR **)propertyId;
  JVar1 = GlobalAPIWrapper_NoRecord<JsGetPropertyNameFromId::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetPropertyNameFromId(_In_ JsPropertyIdRef propertyId, _Outptr_result_z_ const WCHAR **name)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(name);
        *name = nullptr;

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;

        if (propertyRecord->IsSymbol())
        {
            return JsErrorPropertyNotString;
        }

        *name = propertyRecord->GetBuffer();
        return JsNoError;
    });
}